

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O1

string * __thiscall
si9ma::BinaryTree::in_order_serial_abi_cxx11_
          (string *__return_storage_ptr__,BinaryTree *this,TreeNode *head)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint __val;
  uint uVar3;
  long *plVar4;
  uint uVar5;
  size_type *psVar6;
  ulong uVar7;
  TreeNode *extraout_RDX;
  TreeNode *extraout_RDX_00;
  TreeNode *extraout_RDX_01;
  TreeNode *extraout_RDX_02;
  TreeNode *extraout_RDX_03;
  TreeNode *pTVar8;
  uint __len;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  if (this == (BinaryTree *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"#_","");
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    uVar2 = *(uint *)this;
    __val = -uVar2;
    if (0 < (int)uVar2) {
      __val = uVar2;
    }
    __len = 1;
    if (9 < __val) {
      uVar7 = (ulong)__val;
      uVar3 = 4;
      do {
        __len = uVar3;
        uVar5 = (uint)uVar7;
        if (uVar5 < 100) {
          __len = __len - 2;
          goto LAB_0010aa0c;
        }
        if (uVar5 < 1000) {
          __len = __len - 1;
          goto LAB_0010aa0c;
        }
        if (uVar5 < 10000) goto LAB_0010aa0c;
        uVar7 = uVar7 / 10000;
        uVar3 = __len + 4;
      } while (99999 < uVar5);
      __len = __len + 1;
    }
LAB_0010aa0c:
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)((int)uVar2 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + (uVar2 >> 0x1f),__len,__val);
    plVar4 = (long *)std::__cxx11::string::append((char *)local_50);
    paVar1 = &local_78.field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_78.field_2._M_allocated_capacity = *psVar6;
      local_78.field_2._8_8_ = plVar4[3];
      local_78._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_78.field_2._M_allocated_capacity = *psVar6;
      local_78._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_78._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p)
    ;
    pTVar8 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
      pTVar8 = extraout_RDX_00;
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
      pTVar8 = extraout_RDX_01;
    }
    in_order_serial_abi_cxx11_(&local_78,*(BinaryTree **)(this + 8),pTVar8);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p)
    ;
    pTVar8 = extraout_RDX_02;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
      pTVar8 = extraout_RDX_03;
    }
    in_order_serial_abi_cxx11_(&local_78,*(BinaryTree **)(this + 0x10),pTVar8);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string BinaryTree::in_order_serial(const TreeNode *head) {
        if (head == nullptr)
            return "#_";

        string res;
        res += to_string(head->value) + "_";
        res += in_order_serial(head->left);
        res += in_order_serial(head->right);

        return res;
    }